

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints_with_arguments.cpp
# Opt level: O2

Am_Value offset_same_as_procedure(Am_Object *self)

{
  int iVar1;
  undefined4 extraout_var;
  Am_Value *in_value;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  Am_Object *in_RSI;
  Am_Value AVar2;
  Am_Wrapper *this;
  
  *(undefined2 *)&self->data = 0;
  self[1].data = (Am_Object_Data *)0x0;
  iVar1 = (*Am_Object::cc->_vptr_Am_Constraint_Context[6])();
  this = (Am_Wrapper *)CONCAT44(extraout_var,iVar1);
  in_value = Am_Object::Get(in_RSI,*(Am_Slot_Key *)&this->field_0xc,0);
  Am_Value::operator=((Am_Value *)self,in_value);
  Am_Wrapper::Release(this);
  modify_value((Am_Value *)self,*(int *)&this[1].super_Am_Registered_Type._vptr_Am_Registered_Type,
               *(float *)((long)&this[1].super_Am_Registered_Type._vptr_Am_Registered_Type + 4));
  AVar2.value.wrapper_value = extraout_RDX.wrapper_value;
  AVar2._0_8_ = self;
  return AVar2;
}

Assistant:

static Am_Value
offset_same_as_procedure(Am_Object &self)
{
  Am_Value value;
  Key_Offset_Store_Data *store =
      (Key_Offset_Store_Data *)Am_Object_Advanced::Get_Context()->Get_Data();
  value = self.Get(store->key);
  store->Release();
  modify_value(value, store->offset, store->multiplier);
  return value;
}